

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeMultiSuccessorInfo::ReplaceSuccessor
          (PathTypeMultiSuccessorInfo *this,DynamicType *type,PathTypeSuccessorKey key,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef)

{
  code *pcVar1;
  bool bVar2;
  WeakReferenceDictionary<Js::PathTypeSuccessorKey,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  **ppWVar3;
  undefined4 *puVar4;
  WeakReferenceDictionary<Js::PathTypeSuccessorKey,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  *pWVar5;
  RecyclerWeakReference<Js::DynamicType> *pRVar6;
  RecyclerWeakReference<Js::DynamicType> *local_28;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef_local;
  DynamicType *type_local;
  PathTypeMultiSuccessorInfo *this_local;
  PathTypeSuccessorKey key_local;
  
  local_28 = typeWeakRef;
  typeWeakRef_local = (RecyclerWeakReference<Js::DynamicType> *)type;
  type_local = (DynamicType *)this;
  this_local = (PathTypeMultiSuccessorInfo *)key;
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakReferenceDictionary__
                      ((WriteBarrierPtr *)&this->propertySuccessors);
  if (*ppWVar3 ==
      (WeakReferenceDictionary<Js::PathTypeSuccessorKey,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xd7,"(this->propertySuccessors)","this->propertySuccessors");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pWVar5 = Memory::
           WriteBarrierPtr<JsUtil::WeakReferenceDictionary<Js::PathTypeSuccessorKey,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>_>
           ::operator->(&this->propertySuccessors);
  pRVar6 = JsUtil::
           BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
           ::Item(&pWVar5->
                   super_BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                  ,(PathTypeSuccessorKey *)&this_local);
  if (pRVar6 == (RecyclerWeakReference<Js::DynamicType> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xd8,"(propertySuccessors->Item(key))",
                                "propertySuccessors->Item(key)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pWVar5 = Memory::
           WriteBarrierPtr<JsUtil::WeakReferenceDictionary<Js::PathTypeSuccessorKey,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>_>
           ::operator->(&this->propertySuccessors);
  JsUtil::
  BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
  ::Item(&pWVar5->
          super_BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
         ,(PathTypeSuccessorKey *)&this_local,&local_28);
  return;
}

Assistant:

void PathTypeMultiSuccessorInfo::ReplaceSuccessor(DynamicType * type, const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef)
    {
        Assert(this->propertySuccessors);
        Assert(propertySuccessors->Item(key));
        propertySuccessors->Item(key, typeWeakRef);
    }